

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O3

int Gia_ManSatokoCallOne(Gia_Man_t *p,satoko_opts_t *opts,int iOutput)

{
  int iVar1;
  int status;
  int iVar2;
  satoko_t *s;
  satoko_stats_t *psVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  s = Gia_ManSatokoCreate(p,opts);
  if (s == (satoko_t *)0x0) {
    iVar1 = 0;
    status = -1;
  }
  else {
    status = satoko_solve(s);
    psVar3 = satoko_stats(s);
    iVar1 = (int)psVar3->n_conflicts;
    satoko_destroy(s);
  }
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Gia_ManSatokoReport(iOutput,status,lVar5 + lVar4);
  return iVar1;
}

Assistant:

int Gia_ManSatokoCallOne( Gia_Man_t * p, satoko_opts_t * opts, int iOutput )
{
    abctime clk = Abc_Clock();
    satoko_t * pSat;
    int status = SATOKO_UNSAT, Cost = 0;
    pSat = Gia_ManSatokoCreate( p, opts );
    if ( pSat )
    {
        status = satoko_solve( pSat );
        Cost = satoko_stats(pSat)->n_conflicts;
        satoko_destroy( pSat );
    }
    Gia_ManSatokoReport( iOutput, status, Abc_Clock() - clk );
    return Cost;
}